

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::Config> * __thiscall
Catch::Ptr<Catch::Config>::operator=(Ptr<Catch::Config> *this,Config *p)

{
  Ptr<Catch::Config> local_20;
  
  if (p != (Config *)0x0) {
    (*(p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])(p);
  }
  local_20 = (Ptr<Catch::Config>)this->m_p;
  this->m_p = p;
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }